

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Segment::UpdateChunkName(Segment *this,char *ext,char **name)

{
  char *__s;
  size_t __n;
  size_t __n_00;
  char *__dest;
  bool bVar1;
  char ext_chk [64];
  char local_78 [72];
  
  if (ext == (char *)0x0 || name == (char **)0x0) {
    bVar1 = false;
  }
  else {
    snprintf(local_78,0x40,"_%06d.%s",(ulong)(uint)this->chunk_count_,ext);
    __s = this->chunking_base_name_;
    __n = strlen(__s);
    __n_00 = strlen(local_78);
    __dest = (char *)operator_new__(__n_00 + __n + 1,(nothrow_t *)&std::nothrow);
    bVar1 = __dest != (char *)0x0;
    if (bVar1) {
      memcpy(__dest,__s,__n);
      memcpy(__dest + __n,local_78,__n_00);
      __dest[__n_00 + __n] = '\0';
      if (*name != (char *)0x0) {
        operator_delete__(*name);
      }
      *name = __dest;
    }
  }
  return bVar1;
}

Assistant:

bool Segment::UpdateChunkName(const char* ext, char** name) const {
  if (!name || !ext)
    return false;

  char ext_chk[64];
#ifdef _MSC_VER
  sprintf_s(ext_chk, sizeof(ext_chk), "_%06d.%s", chunk_count_, ext);
#else
  snprintf(ext_chk, sizeof(ext_chk), "_%06d.%s", chunk_count_, ext);
#endif

  const size_t chunking_base_name_length = strlen(chunking_base_name_);
  const size_t ext_chk_length = strlen(ext_chk);
  const size_t length = chunking_base_name_length + ext_chk_length + 1;
  char* const str = new (std::nothrow) char[length];  // NOLINT
  if (!str)
    return false;

  memcpy(str, chunking_base_name_, chunking_base_name_length);
  memcpy(&str[chunking_base_name_length], ext_chk, ext_chk_length);
  str[chunking_base_name_length + ext_chk_length] = '\0';

  delete[] * name;
  *name = str;

  return true;
}